

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Geometry *pGVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  Scene *pSVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar33;
  float fVar34;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar35;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar44;
  float fVar45;
  float fVar54;
  float fVar55;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar56;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  float fVar57;
  float fVar62;
  float fVar63;
  undefined1 auVar58 [16];
  float fVar64;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  float fVar80;
  float fVar89;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar87;
  float fVar88;
  undefined1 auVar86 [64];
  float fVar90;
  undefined1 auVar91 [16];
  float fVar99;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar97;
  float fVar98;
  undefined1 auVar96 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [64];
  float fVar103;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar104 [64];
  undefined1 auVar108 [64];
  float fVar109;
  float fVar110;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar111 [64];
  float fVar118;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar119 [64];
  float fVar123;
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar125 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_a99;
  undefined8 local_a98;
  float fStack_a90;
  float fStack_a8c;
  RayQueryContext *local_a88;
  int local_a7c;
  undefined1 local_a78 [16];
  undefined1 local_a68 [8];
  float fStack_a60;
  float fStack_a5c;
  undefined8 local_a58;
  float fStack_a50;
  float fStack_a4c;
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  long local_9e8;
  long local_9e0;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined4 local_9c4;
  uint local_9c0;
  uint local_9bc;
  uint local_9b8;
  RTCFilterFunctionNArguments local_9a8;
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar22 = ray->tfar;
    if (0.0 <= fVar22) {
      puVar10 = local_7d0;
      auVar15 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar2 = (ray->dir).field_0;
      auVar74._8_4_ = 0x7fffffff;
      auVar74._0_8_ = 0x7fffffff7fffffff;
      auVar74._12_4_ = 0x7fffffff;
      auVar74 = vandps_avx((undefined1  [16])aVar2,auVar74);
      auVar65._8_4_ = 0x219392ef;
      auVar65._0_8_ = 0x219392ef219392ef;
      auVar65._12_4_ = 0x219392ef;
      auVar74 = vcmpps_avx(auVar74,auVar65,1);
      auVar66._8_4_ = 0x3f800000;
      auVar66._0_8_ = 0x3f8000003f800000;
      auVar66._12_4_ = 0x3f800000;
      auVar65 = vdivps_avx(auVar66,(undefined1  [16])aVar2);
      auVar67._8_4_ = 0x5d5e0b6b;
      auVar67._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar67._12_4_ = 0x5d5e0b6b;
      auVar74 = vblendvps_avx(auVar65,auVar67,auVar74);
      auVar58._0_4_ = auVar74._0_4_ * 0.99999964;
      auVar58._4_4_ = auVar74._4_4_ * 0.99999964;
      auVar58._8_4_ = auVar74._8_4_ * 0.99999964;
      auVar58._12_4_ = auVar74._12_4_ * 0.99999964;
      auVar46._0_4_ = auVar74._0_4_ * 1.0000004;
      auVar46._4_4_ = auVar74._4_4_ * 1.0000004;
      auVar46._8_4_ = auVar74._8_4_ * 1.0000004;
      auVar46._12_4_ = auVar74._12_4_ * 1.0000004;
      uVar1 = *(undefined4 *)&(ray->org).field_0;
      auVar86 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar96 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar102 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
      auVar74 = vshufps_avx(auVar58,auVar58,0);
      auVar104 = ZEXT1664(auVar74);
      auVar74 = vmovshdup_avx(auVar58);
      auVar65 = vshufps_avx(auVar58,auVar58,0x55);
      auVar108 = ZEXT1664(auVar65);
      auVar65 = vshufpd_avx(auVar58,auVar58,1);
      auVar66 = vshufps_avx(auVar58,auVar58,0xaa);
      auVar61 = ZEXT1664(auVar66);
      auVar66 = vshufps_avx(auVar46,auVar46,0);
      auVar111 = ZEXT1664(auVar66);
      uVar11 = (ulong)(auVar58._0_4_ < 0.0) << 4;
      auVar66 = vshufps_avx(auVar46,auVar46,0x55);
      auVar75 = ZEXT1664(auVar66);
      auVar66 = vshufps_avx(auVar46,auVar46,0xaa);
      auVar53 = ZEXT1664(auVar66);
      uVar8 = (ulong)(auVar74._0_4_ < 0.0) << 4 | 0x20;
      uVar12 = (ulong)(auVar65._0_4_ < 0.0) << 4 | 0x40;
      uVar13 = uVar11 ^ 0x10;
      auVar74 = vshufps_avx(auVar15,auVar15,0);
      auVar79 = ZEXT1664(auVar74);
      auVar74 = vshufps_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22),0);
      auVar119 = ZEXT1664(auVar74);
      local_978 = mm_lookupmask_ps._240_16_;
      local_a88 = context;
      do {
        uVar14 = puVar10[-1];
        puVar10 = puVar10 + -1;
        local_8c8 = auVar86._0_16_;
        local_8d8 = auVar96._0_16_;
        local_8e8 = auVar102._0_16_;
        while ((uVar14 & 8) == 0) {
          auVar74 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar11),local_8c8);
          auVar15._0_4_ = auVar104._0_4_ * auVar74._0_4_;
          auVar15._4_4_ = auVar104._4_4_ * auVar74._4_4_;
          auVar15._8_4_ = auVar104._8_4_ * auVar74._8_4_;
          auVar15._12_4_ = auVar104._12_4_ * auVar74._12_4_;
          auVar74 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar8),local_8d8);
          auVar23._0_4_ = auVar108._0_4_ * auVar74._0_4_;
          auVar23._4_4_ = auVar108._4_4_ * auVar74._4_4_;
          auVar23._8_4_ = auVar108._8_4_ * auVar74._8_4_;
          auVar23._12_4_ = auVar108._12_4_ * auVar74._12_4_;
          auVar74 = vmaxps_avx(auVar15,auVar23);
          auVar65 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar12),local_8e8);
          auVar24._0_4_ = auVar61._0_4_ * auVar65._0_4_;
          auVar24._4_4_ = auVar61._4_4_ * auVar65._4_4_;
          auVar24._8_4_ = auVar61._8_4_ * auVar65._8_4_;
          auVar24._12_4_ = auVar61._12_4_ * auVar65._12_4_;
          auVar65 = vmaxps_avx(auVar24,auVar79._0_16_);
          auVar74 = vmaxps_avx(auVar74,auVar65);
          auVar65 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar13),local_8c8);
          auVar25._0_4_ = auVar111._0_4_ * auVar65._0_4_;
          auVar25._4_4_ = auVar111._4_4_ * auVar65._4_4_;
          auVar25._8_4_ = auVar111._8_4_ * auVar65._8_4_;
          auVar25._12_4_ = auVar111._12_4_ * auVar65._12_4_;
          auVar65 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + (uVar8 ^ 0x10)),local_8d8);
          auVar36._0_4_ = auVar75._0_4_ * auVar65._0_4_;
          auVar36._4_4_ = auVar75._4_4_ * auVar65._4_4_;
          auVar36._8_4_ = auVar75._8_4_ * auVar65._8_4_;
          auVar36._12_4_ = auVar75._12_4_ * auVar65._12_4_;
          auVar65 = vminps_avx(auVar25,auVar36);
          auVar15 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + (uVar12 ^ 0x10)),local_8e8);
          auVar37._0_4_ = auVar53._0_4_ * auVar15._0_4_;
          auVar37._4_4_ = auVar53._4_4_ * auVar15._4_4_;
          auVar37._8_4_ = auVar53._8_4_ * auVar15._8_4_;
          auVar37._12_4_ = auVar53._12_4_ * auVar15._12_4_;
          auVar15 = vminps_avx(auVar37,auVar119._0_16_);
          auVar65 = vminps_avx(auVar65,auVar15);
          auVar74 = vcmpps_avx(auVar74,auVar65,2);
          uVar5 = vmovmskps_avx(auVar74);
          if (uVar5 == 0) goto LAB_002bf711;
          uVar5 = uVar5 & 0xff;
          uVar4 = uVar14 & 0xfffffffffffffff0;
          lVar7 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar14 = *(ulong *)(uVar4 + lVar7 * 8);
          uVar5 = uVar5 - 1 & uVar5;
          if (uVar5 != 0) {
            *puVar10 = uVar14;
            puVar10 = puVar10 + 1;
            lVar7 = 0;
            if (uVar5 != 0) {
              for (; (uVar5 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar14 = *(ulong *)(uVar4 + lVar7 * 8);
            uVar5 = uVar5 - 1 & uVar5;
            uVar6 = (ulong)uVar5;
            if (uVar5 != 0) {
              do {
                *puVar10 = uVar14;
                puVar10 = puVar10 + 1;
                lVar7 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                  }
                }
                uVar14 = *(ulong *)(uVar4 + lVar7 * 8);
                uVar6 = uVar6 & uVar6 - 1;
              } while (uVar6 != 0);
            }
          }
        }
        local_9e8 = (ulong)((uint)uVar14 & 0xf) - 8;
        if (local_9e8 != 0) {
          uVar14 = uVar14 & 0xfffffffffffffff0;
          local_9e0 = 0;
          local_8f8 = auVar104._0_16_;
          local_908 = auVar108._0_16_;
          local_918 = auVar61._0_16_;
          local_928 = auVar111._0_16_;
          local_938 = auVar75._0_16_;
          local_948 = auVar53._0_16_;
          local_958 = auVar79._0_16_;
          local_968 = auVar119._0_16_;
          do {
            lVar7 = local_9e0 * 0xb0;
            uVar1 = *(undefined4 *)&(ray->org).field_0;
            auVar16._4_4_ = uVar1;
            auVar16._0_4_ = uVar1;
            auVar16._8_4_ = uVar1;
            auVar16._12_4_ = uVar1;
            uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar38._4_4_ = uVar1;
            auVar38._0_4_ = uVar1;
            auVar38._8_4_ = uVar1;
            auVar38._12_4_ = uVar1;
            uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar47._4_4_ = uVar1;
            auVar47._0_4_ = uVar1;
            auVar47._8_4_ = uVar1;
            auVar47._12_4_ = uVar1;
            local_a38 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + lVar7),auVar16);
            local_a48 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x10 + lVar7),auVar38);
            local_9f8 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + lVar7),auVar47);
            auVar74 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x30 + lVar7),auVar16);
            auVar65 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x40 + lVar7),auVar38);
            auVar15 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x50 + lVar7),auVar47);
            auVar66 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x60 + lVar7),auVar16);
            auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x70 + lVar7),auVar38);
            auVar58 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x80 + lVar7),auVar47);
            local_a08 = vsubps_avx(auVar66,local_a38);
            local_a18 = vsubps_avx(auVar46,local_a48);
            local_a28 = vsubps_avx(auVar58,local_9f8);
            fVar123 = local_a48._0_4_;
            fVar22 = fVar123 + auVar46._0_4_;
            fVar126 = local_a48._4_4_;
            fVar33 = fVar126 + auVar46._4_4_;
            fVar128 = local_a48._8_4_;
            fVar34 = fVar128 + auVar46._8_4_;
            fVar130 = local_a48._12_4_;
            fVar35 = fVar130 + auVar46._12_4_;
            fVar103 = local_9f8._0_4_;
            fVar57 = fVar103 + auVar58._0_4_;
            fVar105 = local_9f8._4_4_;
            fVar62 = fVar105 + auVar58._4_4_;
            fVar106 = local_9f8._8_4_;
            fVar63 = fVar106 + auVar58._8_4_;
            fVar107 = local_9f8._12_4_;
            fVar64 = fVar107 + auVar58._12_4_;
            fVar44 = local_a28._0_4_;
            auVar91._0_4_ = fVar22 * fVar44;
            fVar54 = local_a28._4_4_;
            auVar91._4_4_ = fVar33 * fVar54;
            fVar55 = local_a28._8_4_;
            auVar91._8_4_ = fVar34 * fVar55;
            fVar45 = local_a28._12_4_;
            auVar91._12_4_ = fVar35 * fVar45;
            fVar132 = local_a18._0_4_;
            auVar100._0_4_ = fVar132 * fVar57;
            fVar135 = local_a18._4_4_;
            auVar100._4_4_ = fVar135 * fVar62;
            fVar138 = local_a18._8_4_;
            auVar100._8_4_ = fVar138 * fVar63;
            fVar141 = local_a18._12_4_;
            auVar100._12_4_ = fVar141 * fVar64;
            auVar67 = vsubps_avx(auVar100,auVar91);
            fVar80 = local_a38._0_4_;
            fVar90 = fVar80 + auVar66._0_4_;
            fVar87 = local_a38._4_4_;
            fVar97 = fVar87 + auVar66._4_4_;
            fVar88 = local_a38._8_4_;
            fVar98 = fVar88 + auVar66._8_4_;
            fVar89 = local_a38._12_4_;
            fVar99 = fVar89 + auVar66._12_4_;
            fVar118 = local_a08._0_4_;
            auVar59._0_4_ = fVar118 * fVar57;
            fVar120 = local_a08._4_4_;
            auVar59._4_4_ = fVar120 * fVar62;
            fVar121 = local_a08._8_4_;
            auVar59._8_4_ = fVar121 * fVar63;
            fVar122 = local_a08._12_4_;
            auVar59._12_4_ = fVar122 * fVar64;
            auVar101._0_4_ = fVar90 * fVar44;
            auVar101._4_4_ = fVar97 * fVar54;
            auVar101._8_4_ = fVar98 * fVar55;
            auVar101._12_4_ = fVar99 * fVar45;
            auVar23 = vsubps_avx(auVar101,auVar59);
            auVar92._0_4_ = fVar90 * fVar132;
            auVar92._4_4_ = fVar97 * fVar135;
            auVar92._8_4_ = fVar98 * fVar138;
            auVar92._12_4_ = fVar99 * fVar141;
            auVar17._0_4_ = fVar118 * fVar22;
            auVar17._4_4_ = fVar120 * fVar33;
            auVar17._8_4_ = fVar121 * fVar34;
            auVar17._12_4_ = fVar122 * fVar35;
            auVar24 = vsubps_avx(auVar17,auVar92);
            fVar22 = (ray->dir).field_0.m128[2];
            local_a98._4_4_ = (ray->dir).field_0.m128[1];
            local_a58._4_4_ = (ray->dir).field_0.m128[0];
            local_a78._0_4_ =
                 local_a58._4_4_ * auVar67._0_4_ +
                 fVar22 * auVar24._0_4_ + local_a98._4_4_ * auVar23._0_4_;
            local_a78._4_4_ =
                 local_a58._4_4_ * auVar67._4_4_ +
                 fVar22 * auVar24._4_4_ + local_a98._4_4_ * auVar23._4_4_;
            local_a78._8_4_ =
                 local_a58._4_4_ * auVar67._8_4_ +
                 fVar22 * auVar24._8_4_ + local_a98._4_4_ * auVar23._8_4_;
            local_a78._12_4_ =
                 local_a58._4_4_ * auVar67._12_4_ +
                 fVar22 * auVar24._12_4_ + local_a98._4_4_ * auVar23._12_4_;
            local_898 = vsubps_avx(local_a48,auVar65);
            local_8a8 = vsubps_avx(local_9f8,auVar15);
            fVar33 = fVar123 + auVar65._0_4_;
            fVar34 = fVar126 + auVar65._4_4_;
            fVar35 = fVar128 + auVar65._8_4_;
            fVar57 = fVar130 + auVar65._12_4_;
            fVar62 = fVar103 + auVar15._0_4_;
            fVar63 = fVar105 + auVar15._4_4_;
            fVar64 = fVar106 + auVar15._8_4_;
            fVar90 = fVar107 + auVar15._12_4_;
            fVar109 = local_8a8._0_4_;
            auVar26._0_4_ = fVar109 * fVar33;
            fVar112 = local_8a8._4_4_;
            auVar26._4_4_ = fVar112 * fVar34;
            fVar114 = local_8a8._8_4_;
            auVar26._8_4_ = fVar114 * fVar35;
            fVar116 = local_8a8._12_4_;
            auVar26._12_4_ = fVar116 * fVar57;
            fVar133 = local_898._0_4_;
            auVar125._0_4_ = fVar133 * fVar62;
            fVar136 = local_898._4_4_;
            auVar125._4_4_ = fVar136 * fVar63;
            fVar139 = local_898._8_4_;
            auVar125._8_4_ = fVar139 * fVar64;
            fVar142 = local_898._12_4_;
            auVar125._12_4_ = fVar142 * fVar90;
            auVar67 = vsubps_avx(auVar125,auVar26);
            auVar23 = vsubps_avx(local_a38,auVar74);
            fVar124 = auVar23._0_4_;
            auVar60._0_4_ = fVar124 * fVar62;
            fVar127 = auVar23._4_4_;
            auVar60._4_4_ = fVar127 * fVar63;
            fVar129 = auVar23._8_4_;
            auVar60._8_4_ = fVar129 * fVar64;
            fVar131 = auVar23._12_4_;
            auVar60._12_4_ = fVar131 * fVar90;
            fVar62 = fVar80 + auVar74._0_4_;
            fVar63 = fVar87 + auVar74._4_4_;
            fVar64 = fVar88 + auVar74._8_4_;
            fVar90 = fVar89 + auVar74._12_4_;
            auVar93._0_4_ = fVar109 * fVar62;
            auVar93._4_4_ = fVar112 * fVar63;
            auVar93._8_4_ = fVar114 * fVar64;
            auVar93._12_4_ = fVar116 * fVar90;
            auVar23 = vsubps_avx(auVar93,auVar60);
            auVar94._8_4_ = 0x7fffffff;
            auVar94._0_8_ = 0x7fffffff7fffffff;
            auVar94._12_4_ = 0x7fffffff;
            auVar81._0_4_ = fVar133 * fVar62;
            auVar81._4_4_ = fVar136 * fVar63;
            auVar81._8_4_ = fVar139 * fVar64;
            auVar81._12_4_ = fVar142 * fVar90;
            auVar18._0_4_ = fVar124 * fVar33;
            auVar18._4_4_ = fVar127 * fVar34;
            auVar18._8_4_ = fVar129 * fVar35;
            auVar18._12_4_ = fVar131 * fVar57;
            auVar24 = vsubps_avx(auVar18,auVar81);
            local_a68._0_4_ = auVar67._0_4_;
            local_a68._4_4_ = auVar67._4_4_;
            fStack_a60 = auVar67._8_4_;
            fStack_a5c = auVar67._12_4_;
            local_878._0_4_ =
                 local_a58._4_4_ * (float)local_a68._0_4_ +
                 fVar22 * auVar24._0_4_ + local_a98._4_4_ * auVar23._0_4_;
            local_878._4_4_ =
                 local_a58._4_4_ * (float)local_a68._4_4_ +
                 fVar22 * auVar24._4_4_ + local_a98._4_4_ * auVar23._4_4_;
            local_878._8_4_ =
                 local_a58._4_4_ * fStack_a60 +
                 fVar22 * auVar24._8_4_ + local_a98._4_4_ * auVar23._8_4_;
            local_878._12_4_ =
                 local_a58._4_4_ * fStack_a5c +
                 fVar22 * auVar24._12_4_ + local_a98._4_4_ * auVar23._12_4_;
            auVar67 = vsubps_avx(auVar74,auVar66);
            fVar62 = auVar74._0_4_ + auVar66._0_4_;
            fVar63 = auVar74._4_4_ + auVar66._4_4_;
            fVar64 = auVar74._8_4_ + auVar66._8_4_;
            fVar90 = auVar74._12_4_ + auVar66._12_4_;
            auVar74 = vsubps_avx(auVar65,auVar46);
            fVar97 = auVar65._0_4_ + auVar46._0_4_;
            fVar98 = auVar65._4_4_ + auVar46._4_4_;
            fVar99 = auVar65._8_4_ + auVar46._8_4_;
            fVar43 = auVar65._12_4_ + auVar46._12_4_;
            auVar65 = vsubps_avx(auVar15,auVar58);
            fVar34 = auVar15._0_4_ + auVar58._0_4_;
            fVar35 = auVar15._4_4_ + auVar58._4_4_;
            fVar57 = auVar15._8_4_ + auVar58._8_4_;
            fVar56 = auVar15._12_4_ + auVar58._12_4_;
            fVar134 = auVar65._0_4_;
            auVar68._0_4_ = fVar134 * fVar97;
            fVar137 = auVar65._4_4_;
            auVar68._4_4_ = fVar137 * fVar98;
            fVar140 = auVar65._8_4_;
            auVar68._8_4_ = fVar140 * fVar99;
            fVar143 = auVar65._12_4_;
            auVar68._12_4_ = fVar143 * fVar43;
            fVar110 = auVar74._0_4_;
            auVar82._0_4_ = fVar110 * fVar34;
            fVar113 = auVar74._4_4_;
            auVar82._4_4_ = fVar113 * fVar35;
            fVar115 = auVar74._8_4_;
            auVar82._8_4_ = fVar115 * fVar57;
            fVar117 = auVar74._12_4_;
            auVar82._12_4_ = fVar117 * fVar56;
            auVar74 = vsubps_avx(auVar82,auVar68);
            fVar33 = auVar67._0_4_;
            auVar48._0_4_ = fVar33 * fVar34;
            fVar34 = auVar67._4_4_;
            auVar48._4_4_ = fVar34 * fVar35;
            fVar35 = auVar67._8_4_;
            auVar48._8_4_ = fVar35 * fVar57;
            fVar57 = auVar67._12_4_;
            auVar48._12_4_ = fVar57 * fVar56;
            auVar83._0_4_ = fVar134 * fVar62;
            auVar83._4_4_ = fVar137 * fVar63;
            auVar83._8_4_ = fVar140 * fVar64;
            auVar83._12_4_ = fVar143 * fVar90;
            auVar65 = vsubps_avx(auVar83,auVar48);
            auVar27._0_4_ = fVar110 * fVar62;
            auVar27._4_4_ = fVar113 * fVar63;
            auVar27._8_4_ = fVar115 * fVar64;
            auVar27._12_4_ = fVar117 * fVar90;
            auVar39._0_4_ = fVar33 * fVar97;
            auVar39._4_4_ = fVar34 * fVar98;
            auVar39._8_4_ = fVar35 * fVar99;
            auVar39._12_4_ = fVar57 * fVar43;
            auVar15 = vsubps_avx(auVar39,auVar27);
            local_a98._0_4_ = local_a98._4_4_;
            fStack_a90 = local_a98._4_4_;
            fStack_a8c = local_a98._4_4_;
            local_a58._0_4_ = local_a58._4_4_;
            fStack_a50 = local_a58._4_4_;
            fStack_a4c = local_a58._4_4_;
            auVar28._0_4_ =
                 local_a58._4_4_ * auVar74._0_4_ +
                 fVar22 * auVar15._0_4_ + local_a98._4_4_ * auVar65._0_4_;
            auVar28._4_4_ =
                 local_a58._4_4_ * auVar74._4_4_ +
                 fVar22 * auVar15._4_4_ + local_a98._4_4_ * auVar65._4_4_;
            auVar28._8_4_ =
                 local_a58._4_4_ * auVar74._8_4_ +
                 fVar22 * auVar15._8_4_ + local_a98._4_4_ * auVar65._8_4_;
            auVar28._12_4_ =
                 local_a58._4_4_ * auVar74._12_4_ +
                 fVar22 * auVar15._12_4_ + local_a98._4_4_ * auVar65._12_4_;
            local_868._0_4_ = auVar28._0_4_ + local_a78._0_4_ + local_878._0_4_;
            local_868._4_4_ = auVar28._4_4_ + local_a78._4_4_ + local_878._4_4_;
            local_868._8_4_ = auVar28._8_4_ + local_a78._8_4_ + local_878._8_4_;
            local_868._12_4_ = auVar28._12_4_ + local_a78._12_4_ + local_878._12_4_;
            auVar74 = vminps_avx(local_a78,local_878);
            auVar74 = vminps_avx(auVar74,auVar28);
            _local_a68 = vandps_avx(local_868,auVar94);
            auVar49._0_4_ = local_a68._0_4_ * 1.1920929e-07;
            auVar49._4_4_ = local_a68._4_4_ * 1.1920929e-07;
            auVar49._8_4_ = local_a68._8_4_ * 1.1920929e-07;
            auVar49._12_4_ = local_a68._12_4_ * 1.1920929e-07;
            uVar4 = CONCAT44(auVar49._4_4_,auVar49._0_4_);
            auVar69._0_8_ = uVar4 ^ 0x8000000080000000;
            auVar69._8_4_ = -auVar49._8_4_;
            auVar69._12_4_ = -auVar49._12_4_;
            auVar74 = vcmpps_avx(auVar74,auVar69,5);
            auVar65 = vmaxps_avx(local_a78,local_878);
            auVar65 = vmaxps_avx(auVar65,auVar28);
            auVar65 = vcmpps_avx(auVar65,auVar49,2);
            local_8b8 = vorps_avx(auVar74,auVar65);
            auVar74 = local_978 & local_8b8;
            if ((((auVar74 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar74 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar74 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar74[0xf] < '\0') {
              auVar29._0_4_ = fVar133 * fVar44;
              auVar29._4_4_ = fVar136 * fVar54;
              auVar29._8_4_ = fVar139 * fVar55;
              auVar29._12_4_ = fVar142 * fVar45;
              auVar40._0_4_ = fVar132 * fVar109;
              auVar40._4_4_ = fVar135 * fVar112;
              auVar40._8_4_ = fVar138 * fVar114;
              auVar40._12_4_ = fVar141 * fVar116;
              auVar15 = vsubps_avx(auVar40,auVar29);
              auVar50._0_4_ = fVar110 * fVar109;
              auVar50._4_4_ = fVar113 * fVar112;
              auVar50._8_4_ = fVar115 * fVar114;
              auVar50._12_4_ = fVar117 * fVar116;
              auVar70._0_4_ = fVar133 * fVar134;
              auVar70._4_4_ = fVar136 * fVar137;
              auVar70._8_4_ = fVar139 * fVar140;
              auVar70._12_4_ = fVar142 * fVar143;
              auVar66 = vsubps_avx(auVar70,auVar50);
              auVar74 = vandps_avx(auVar94,auVar29);
              auVar65 = vandps_avx(auVar94,auVar50);
              auVar74 = vcmpps_avx(auVar74,auVar65,1);
              local_808 = vblendvps_avx(auVar66,auVar15,auVar74);
              auVar41._0_4_ = fVar124 * fVar134;
              auVar41._4_4_ = fVar127 * fVar137;
              auVar41._8_4_ = fVar129 * fVar140;
              auVar41._12_4_ = fVar131 * fVar143;
              auVar51._0_4_ = fVar124 * fVar44;
              auVar51._4_4_ = fVar127 * fVar54;
              auVar51._8_4_ = fVar129 * fVar55;
              auVar51._12_4_ = fVar131 * fVar45;
              auVar71._0_4_ = fVar109 * fVar118;
              auVar71._4_4_ = fVar112 * fVar120;
              auVar71._8_4_ = fVar114 * fVar121;
              auVar71._12_4_ = fVar116 * fVar122;
              auVar15 = vsubps_avx(auVar51,auVar71);
              auVar76._0_4_ = fVar109 * fVar33;
              auVar76._4_4_ = fVar112 * fVar34;
              auVar76._8_4_ = fVar114 * fVar35;
              auVar76._12_4_ = fVar116 * fVar57;
              auVar66 = vsubps_avx(auVar76,auVar41);
              auVar74 = vandps_avx(auVar94,auVar71);
              auVar65 = vandps_avx(auVar94,auVar41);
              auVar74 = vcmpps_avx(auVar74,auVar65,1);
              local_7f8 = vblendvps_avx(auVar66,auVar15,auVar74);
              auVar19._0_4_ = fVar133 * fVar33;
              auVar19._4_4_ = fVar136 * fVar34;
              auVar19._8_4_ = fVar139 * fVar35;
              auVar19._12_4_ = fVar142 * fVar57;
              auVar52._0_4_ = fVar133 * fVar118;
              auVar52._4_4_ = fVar136 * fVar120;
              auVar52._8_4_ = fVar139 * fVar121;
              auVar52._12_4_ = fVar142 * fVar122;
              auVar72._0_4_ = fVar124 * fVar132;
              auVar72._4_4_ = fVar127 * fVar135;
              auVar72._8_4_ = fVar129 * fVar138;
              auVar72._12_4_ = fVar131 * fVar141;
              auVar77._0_4_ = fVar124 * fVar110;
              auVar77._4_4_ = fVar127 * fVar113;
              auVar77._8_4_ = fVar129 * fVar115;
              auVar77._12_4_ = fVar131 * fVar117;
              auVar15 = vsubps_avx(auVar52,auVar72);
              auVar66 = vsubps_avx(auVar77,auVar19);
              auVar74 = vandps_avx(auVar94,auVar72);
              auVar65 = vandps_avx(auVar94,auVar19);
              auVar74 = vcmpps_avx(auVar74,auVar65,1);
              local_7e8 = vblendvps_avx(auVar66,auVar15,auVar74);
              fVar44 = local_808._0_4_ * local_a58._4_4_ +
                       fVar22 * local_7e8._0_4_ + local_7f8._0_4_ * local_a98._4_4_;
              fVar54 = local_808._4_4_ * local_a58._4_4_ +
                       fVar22 * local_7e8._4_4_ + local_7f8._4_4_ * local_a98._4_4_;
              fVar55 = local_808._8_4_ * local_a58._4_4_ +
                       fVar22 * local_7e8._8_4_ + local_7f8._8_4_ * local_a98._4_4_;
              fVar22 = local_808._12_4_ * local_a58._4_4_ +
                       fVar22 * local_7e8._12_4_ + local_7f8._12_4_ * local_a98._4_4_;
              auVar73._0_4_ = fVar44 + fVar44;
              auVar73._4_4_ = fVar54 + fVar54;
              auVar73._8_4_ = fVar55 + fVar55;
              auVar73._12_4_ = fVar22 + fVar22;
              fVar45 = local_808._0_4_ * fVar80 +
                       local_7e8._0_4_ * fVar103 + local_7f8._0_4_ * fVar123;
              fVar33 = local_808._4_4_ * fVar87 +
                       local_7e8._4_4_ * fVar105 + local_7f8._4_4_ * fVar126;
              fVar34 = local_808._8_4_ * fVar88 +
                       local_7e8._8_4_ * fVar106 + local_7f8._8_4_ * fVar128;
              fVar35 = local_808._12_4_ * fVar89 +
                       local_7e8._12_4_ * fVar107 + local_7f8._12_4_ * fVar130;
              auVar74 = vrcpps_avx(auVar73);
              fVar22 = auVar74._0_4_;
              auVar84._0_4_ = auVar73._0_4_ * fVar22;
              fVar44 = auVar74._4_4_;
              auVar84._4_4_ = auVar73._4_4_ * fVar44;
              fVar54 = auVar74._8_4_;
              auVar84._8_4_ = auVar73._8_4_ * fVar54;
              fVar55 = auVar74._12_4_;
              auVar84._12_4_ = auVar73._12_4_ * fVar55;
              auVar95._8_4_ = 0x3f800000;
              auVar95._0_8_ = 0x3f8000003f800000;
              auVar95._12_4_ = 0x3f800000;
              auVar74 = vsubps_avx(auVar95,auVar84);
              local_818._0_4_ = (fVar45 + fVar45) * (fVar22 + fVar22 * auVar74._0_4_);
              local_818._4_4_ = (fVar33 + fVar33) * (fVar44 + fVar44 * auVar74._4_4_);
              local_818._8_4_ = (fVar34 + fVar34) * (fVar54 + fVar54 * auVar74._8_4_);
              local_818._12_4_ = (fVar35 + fVar35) * (fVar55 + fVar55 * auVar74._12_4_);
              uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar78._4_4_ = uVar1;
              auVar78._0_4_ = uVar1;
              auVar78._8_4_ = uVar1;
              auVar78._12_4_ = uVar1;
              auVar74 = vcmpps_avx(auVar78,local_818,2);
              fVar22 = ray->tfar;
              auVar85._4_4_ = fVar22;
              auVar85._0_4_ = fVar22;
              auVar85._8_4_ = fVar22;
              auVar85._12_4_ = fVar22;
              auVar65 = vcmpps_avx(local_818,auVar85,2);
              auVar74 = vandps_avx(auVar74,auVar65);
              auVar65 = vcmpps_avx(auVar73,_DAT_01f7aa10,4);
              auVar74 = vandps_avx(auVar65,auVar74);
              auVar65 = vpand_avx(local_8b8,local_978);
              auVar74 = vpslld_avx(auVar74,0x1f);
              auVar74 = vpsrad_avx(auVar74,0x1f);
              local_848 = vpand_avx(auVar74,auVar65);
              uVar5 = vmovmskps_avx(local_848);
              if (uVar5 != 0) {
                local_a98 = lVar7 + uVar14;
                local_888 = local_a78;
                local_858 = &local_a99;
                auVar74 = vrcpps_avx(local_868);
                fVar22 = auVar74._0_4_;
                auVar30._0_4_ = local_868._0_4_ * fVar22;
                fVar44 = auVar74._4_4_;
                auVar30._4_4_ = local_868._4_4_ * fVar44;
                fVar54 = auVar74._8_4_;
                auVar30._8_4_ = local_868._8_4_ * fVar54;
                fVar55 = auVar74._12_4_;
                auVar30._12_4_ = local_868._12_4_ * fVar55;
                auVar42._8_4_ = 0x3f800000;
                auVar42._0_8_ = 0x3f8000003f800000;
                auVar42._12_4_ = 0x3f800000;
                auVar74 = vsubps_avx(auVar42,auVar30);
                auVar20._0_4_ = fVar22 + fVar22 * auVar74._0_4_;
                auVar20._4_4_ = fVar44 + fVar44 * auVar74._4_4_;
                auVar20._8_4_ = fVar54 + fVar54 * auVar74._8_4_;
                auVar20._12_4_ = fVar55 + fVar55 * auVar74._12_4_;
                auVar31._8_4_ = 0x219392ef;
                auVar31._0_8_ = 0x219392ef219392ef;
                auVar31._12_4_ = 0x219392ef;
                auVar74 = vcmpps_avx(_local_a68,auVar31,5);
                auVar74 = vandps_avx(auVar74,auVar20);
                auVar32._0_4_ = local_a78._0_4_ * auVar74._0_4_;
                auVar32._4_4_ = local_a78._4_4_ * auVar74._4_4_;
                auVar32._8_4_ = local_a78._8_4_ * auVar74._8_4_;
                auVar32._12_4_ = local_a78._12_4_ * auVar74._12_4_;
                local_838 = vminps_avx(auVar32,auVar42);
                auVar21._0_4_ = local_878._0_4_ * auVar74._0_4_;
                auVar21._4_4_ = local_878._4_4_ * auVar74._4_4_;
                auVar21._8_4_ = local_878._8_4_ * auVar74._8_4_;
                auVar21._12_4_ = local_878._12_4_ * auVar74._12_4_;
                local_828 = vminps_avx(auVar21,auVar42);
                uVar4 = (ulong)(uVar5 & 0xff);
                local_a58 = local_a88->scene;
                lVar7 = lVar7 + uVar14;
                pSVar9 = local_a88->scene;
                do {
                  uVar6 = 0;
                  if (uVar4 != 0) {
                    for (; (uVar4 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                    }
                  }
                  local_9c0 = *(uint *)(lVar7 + 0x90 + uVar6 * 4);
                  pGVar3 = (pSVar9->geometries).items[local_9c0].ptr;
                  if ((pGVar3->mask & ray->mask) == 0) {
                    uVar4 = uVar4 ^ 1L << (uVar6 & 0x3f);
                  }
                  else {
                    local_a78._0_8_ = uVar6;
                    local_a68 = (undefined1  [8])uVar4;
                    if ((local_a88->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002bf721;
                    local_a38._0_8_ = local_a88->args;
                    local_a08._0_8_ = uVar11;
                    local_9f8._0_8_ = puVar10;
                    local_9a8.context = local_a88->user;
                    local_9d8 = *(undefined4 *)(local_808 + uVar6 * 4);
                    local_9d4 = *(undefined4 *)(local_7f8 + uVar6 * 4);
                    local_9d0 = *(undefined4 *)(local_7e8 + uVar6 * 4);
                    local_9cc = *(undefined4 *)(local_838 + uVar6 * 4);
                    local_9c8 = *(undefined4 *)(local_828 + uVar6 * 4);
                    local_9c4 = *(undefined4 *)(local_a98 + 0xa0 + uVar6 * 4);
                    local_9bc = (local_9a8.context)->instID[0];
                    local_9b8 = (local_9a8.context)->instPrimID[0];
                    local_a18._0_4_ = ray->tfar;
                    ray->tfar = *(float *)(local_818 + uVar6 * 4);
                    local_a7c = -1;
                    local_9a8.valid = &local_a7c;
                    local_9a8.geometryUserPtr = pGVar3->userPtr;
                    local_a48._0_8_ = ray;
                    local_9a8.hit = (RTCHitN *)&local_9d8;
                    local_9a8.N = 1;
                    local_a28._0_8_ = pGVar3;
                    local_9a8.ray = (RTCRayN *)ray;
                    if ((pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar3->occlusionFilterN)(&local_9a8), *local_9a8.valid != 0)) {
                      ray = (Ray *)local_a48._0_8_;
                      if ((*(code **)(local_a38._0_8_ + 0x10) == (code *)0x0) ||
                         (((*(byte *)local_a38._0_8_ & 2) == 0 &&
                          ((*(byte *)(local_a28._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_002bf721:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      (**(code **)(local_a38._0_8_ + 0x10))(&local_9a8);
                      ray = (Ray *)local_a48._0_8_;
                      if (*local_9a8.valid != 0) goto LAB_002bf721;
                    }
                    *(undefined4 *)(local_a48._0_8_ + 0x20) = local_a18._0_4_;
                    uVar4 = (ulong)local_a68 ^ 1L << (local_a78._0_8_ & 0x3f);
                    ray = (Ray *)local_a48._0_8_;
                    puVar10 = (ulong *)local_9f8._0_8_;
                    uVar11 = local_a08._0_8_;
                  }
                  lVar7 = local_a98;
                  pSVar9 = local_a58;
                } while (uVar4 != 0);
              }
            }
            local_9e0 = local_9e0 + 1;
            auVar86 = ZEXT1664(local_8c8);
            auVar96 = ZEXT1664(local_8d8);
            auVar102 = ZEXT1664(local_8e8);
            auVar104 = ZEXT1664(local_8f8);
            auVar108 = ZEXT1664(local_908);
            auVar61 = ZEXT1664(local_918);
            auVar111 = ZEXT1664(local_928);
            auVar75 = ZEXT1664(local_938);
            auVar53 = ZEXT1664(local_948);
            auVar79 = ZEXT1664(local_958);
            auVar119 = ZEXT1664(local_968);
          } while (local_9e0 != local_9e8);
        }
LAB_002bf711:
      } while (puVar10 != &local_7d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }